

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

Boxed_Value * __thiscall
chaiscript::detail::Dispatch_Engine::add_get_object
          (Dispatch_Engine *this,string *t_name,Boxed_Value *obj,Stack_Holder *t_holder)

{
  StackData *this_00;
  reference this_01;
  pointer ppVar1;
  name_conflict_error *this_02;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
  pVar2;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  local_70;
  __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
  local_40;
  pair<__gnu_cxx::__normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>,_bool>
  result;
  value_type *stack_elem;
  Stack_Holder *t_holder_local;
  Boxed_Value *obj_local;
  string *t_name_local;
  Dispatch_Engine *this_local;
  
  this_00 = get_stack_data_abi_cxx11_(t_holder);
  this_01 = std::
            vector<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>,_std::allocator<chaiscript::utility::QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>_>_>
            ::back(this_00);
  result._8_8_ = this_01;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_true>
            (&local_70,t_name,obj);
  pVar2 = utility::
          QuickFlatMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value,_chaiscript::str_equal>
          ::insert(this_01,&local_70);
  local_40 = pVar2.first._M_current;
  result.first._M_current._0_1_ = pVar2.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>
  ::~pair(&local_70);
  if (((byte)result.first._M_current & 1) != 0) {
    ppVar1 = __gnu_cxx::
             __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
             ::operator->(&local_40);
    return &ppVar1->second;
  }
  this_02 = (name_conflict_error *)__cxa_allocate_exception(0x30);
  ppVar1 = __gnu_cxx::
           __normal_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_chaiscript::Boxed_Value>_>_>_>
           ::operator->(&local_40);
  chaiscript::exception::name_conflict_error::name_conflict_error(this_02,&ppVar1->first);
  __cxa_throw(this_02,&chaiscript::exception::name_conflict_error::typeinfo,
              chaiscript::exception::name_conflict_error::~name_conflict_error);
}

Assistant:

Boxed_Value &add_get_object(std::string t_name, Boxed_Value obj, Stack_Holder &t_holder) {
        auto &stack_elem = get_stack_data(t_holder).back();

        if (auto result = stack_elem.insert(std::pair{std::move(t_name), std::move(obj)}); result.second) {
          return result.first->second;
        } else {
          // insert failed
          throw chaiscript::exception::name_conflict_error(result.first->first);
        }
      }